

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O2

void __thiscall
duckdb::RLECompressState<int,_true>::WriteValue
          (RLECompressState<int,_true> *this,int value,rle_count_t count,bool is_null)

{
  unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true> *this_00;
  atomic<unsigned_long> *paVar1;
  int iVar2;
  idx_t iVar3;
  idx_t iVar4;
  __int_type _Var5;
  data_ptr_t pdVar6;
  pointer pCVar7;
  int iVar8;
  undefined7 in_register_00000009;
  
  pdVar6 = BufferHandle::Ptr(&this->handle);
  iVar3 = this->entry_count;
  iVar4 = this->max_rle_count;
  *(int *)(pdVar6 + iVar3 * 4 + 8) = value;
  *(rle_count_t *)(pdVar6 + iVar3 * 2 + iVar4 * 4 + 8) = count;
  this->entry_count = iVar3 + 1;
  if ((int)CONCAT71(in_register_00000009,is_null) == 0) {
    pCVar7 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
             operator->(&this->current_segment);
    iVar8 = *(int *)((long)&(pCVar7->stats).statistics.stats_union + 8);
    iVar2 = *(int *)((long)&(pCVar7->stats).statistics.stats_union + 0x18);
    if (value <= iVar8) {
      iVar8 = value;
    }
    *(int *)((long)&(pCVar7->stats).statistics.stats_union + 8) = iVar8;
    if (value < iVar2) {
      value = iVar2;
    }
    *(int *)((long)&(pCVar7->stats).statistics.stats_union + 0x18) = value;
  }
  this_00 = &this->current_segment;
  pCVar7 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->(this_00);
  LOCK();
  paVar1 = &(pCVar7->super_SegmentBase<duckdb::ColumnSegment>).count;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + (ulong)count;
  UNLOCK();
  if (this->entry_count == this->max_rle_count) {
    pCVar7 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
             operator->(this_00);
    iVar3 = (pCVar7->super_SegmentBase<duckdb::ColumnSegment>).start;
    pCVar7 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
             operator->(this_00);
    _Var5 = (pCVar7->super_SegmentBase<duckdb::ColumnSegment>).count.
            super___atomic_base<unsigned_long>._M_i;
    FlushSegment(this);
    CreateEmptySegment(this,_Var5 + iVar3);
    this->entry_count = 0;
  }
  return;
}

Assistant:

void WriteValue(T value, rle_count_t count, bool is_null) {
		// write the RLE entry
		auto handle_ptr = handle.Ptr() + RLEConstants::RLE_HEADER_SIZE;
		auto data_pointer = reinterpret_cast<T *>(handle_ptr);
		auto index_pointer = reinterpret_cast<rle_count_t *>(handle_ptr + max_rle_count * sizeof(T));
		data_pointer[entry_count] = value;
		index_pointer[entry_count] = count;
		entry_count++;

		// update meta data
		if (WRITE_STATISTICS && !is_null) {
			current_segment->stats.statistics.UpdateNumericStats<T>(value);
		}
		current_segment->count += count;

		if (entry_count == max_rle_count) {
			// we have finished writing this segment: flush it and create a new segment
			auto row_start = current_segment->start + current_segment->count;
			FlushSegment();
			CreateEmptySegment(row_start);
			entry_count = 0;
		}
	}